

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraSublimeTextGenerator::BuildMakeCommand
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,string *make,
          char *makefile,string *target)

{
  bool bVar1;
  char *path;
  char *path_00;
  char *path_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  undefined1 local_128 [8];
  string makefileName_2;
  undefined1 local_e8 [8];
  string makefileName_1;
  undefined1 local_a8 [8];
  string makefileName;
  string generator;
  allocator local_32;
  byte local_31;
  string *local_30;
  string *target_local;
  char *makefile_local;
  string *make_local;
  cmExtraSublimeTextGenerator *this_local;
  string *command;
  
  local_31 = 0;
  local_30 = target;
  target_local = (string *)makefile;
  makefile_local = (char *)make;
  make_local = (string *)this;
  this_local = (cmExtraSublimeTextGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"\"",&local_32);
  std::allocator<char>::~allocator((allocator<char> *)&local_32);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&generator.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)makefile_local
                 ,"\"");
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,(string *)(generator.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(generator.field_2._M_local_buf + 8));
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[2])
            ((undefined1 *)((long)&makefileName.field_2 + 8));
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&makefileName.field_2 + 8),"NMake Makefiles");
  if (bVar1) {
    cmSystemTools::ConvertToOutputPath_abi_cxx11_
              ((string *)local_a8,(cmSystemTools *)target_local,path);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", \"/NOLOGO\", \"/f\", \"");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&makefileName_1.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   "\"");
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,(string *)(makefileName_1.field_2._M_local_buf + 8))
    ;
    std::__cxx11::string::~string((string *)(makefileName_1.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", \"VERBOSE=1\", \"");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_30);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
    std::__cxx11::string::~string((string *)local_a8);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&makefileName.field_2 + 8),"Ninja");
    if (bVar1) {
      cmSystemTools::ConvertToOutputPath_abi_cxx11_
                ((string *)local_e8,(cmSystemTools *)target_local,path_00);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", \"-f\", \"");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&makefileName_2.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                     "\"");
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,
                 (string *)(makefileName_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(makefileName_2.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", \"-v\", \"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_30);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
      std::__cxx11::string::~string((string *)local_e8);
    }
    else {
      std::__cxx11::string::string((string *)local_128);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&makefileName.field_2 + 8),"MinGW Makefiles");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_128,(char *)target_local);
      }
      else {
        cmSystemTools::ConvertToOutputPath_abi_cxx11_
                  (&local_148,(cmSystemTools *)target_local,path_01);
        std::__cxx11::string::operator=((string *)local_128,(string *)&local_148);
        std::__cxx11::string::~string((string *)&local_148);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", \"-f\", \"");
      std::operator+(&local_168,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                     "\"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", \"VERBOSE=1\", \"");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_30);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\"");
      std::__cxx11::string::~string((string *)local_128);
    }
  }
  local_31 = 1;
  std::__cxx11::string::~string((string *)(makefileName.field_2._M_local_buf + 8));
  if ((local_31 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraSublimeTextGenerator::BuildMakeCommand(
             const std::string& make, const char* makefile,
             const std::string& target)
{
  std::string command = "\"";
  command += make + "\"";
  std::string generator = this->GlobalGenerator->GetName();
  if (generator == "NMake Makefiles")
    {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += ", \"/NOLOGO\", \"/f\", \"";
    command += makefileName + "\"";
    command += ", \"VERBOSE=1\", \"";
    command += target;
    command += "\"";
    }
  else if (generator == "Ninja")
    {
    std::string makefileName = cmSystemTools::ConvertToOutputPath(makefile);
    command += ", \"-f\", \"";
    command += makefileName + "\"";
    command += ", \"-v\", \"";
    command += target;
    command += "\"";
    }
  else
    {
    std::string makefileName;
    if (generator == "MinGW Makefiles")
      {
        // no escaping of spaces in this case, see
        // http://public.kitware.com/Bug/view.php?id=10014
        makefileName = makefile;
      }
      else
      {
        makefileName = cmSystemTools::ConvertToOutputPath(makefile);
      }
    command += ", \"-f\", \"";
    command += makefileName + "\"";
    command += ", \"VERBOSE=1\", \"";
    command += target;
    command += "\"";
    }
  return command;
}